

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnscapPlugIn.cpp
# Opt level: O2

int libithicap_close(my_bpftimeval ts)

{
  DnsStats *this;
  bool bVar1;
  int iVar2;
  int iVar3;
  CaptureSummary cs;
  
  CaptureSummary::CaptureSummary(&cs);
  this = libithicap_stats;
  iVar2 = -1;
  iVar3 = iVar2;
  if ((libithicap_stats != (DnsStats *)0x0) && (libithicap_stats->is_capture_stopped == false)) {
    libithicap_stats->is_capture_stopped = true;
    bVar1 = DnsStats::ExportToCaptureSummary(this,&cs);
    if (bVar1) {
      bVar1 = CaptureSummary::Save(&cs,libithicap_out_file);
      iVar3 = 0;
      if ((!bVar1) && (iVar3 = iVar2, logerr != (logerr_t *)0x0)) {
        (*logerr)("libithicap cannot save the capture summary on <%s>.\n",libithicap_out_file);
      }
    }
    else if (logerr != (logerr_t *)0x0) {
      (*logerr)("libithicap cannot process the capture summary.\n");
    }
  }
  CaptureSummary::~CaptureSummary(&cs);
  return iVar3;
}

Assistant:

int libithicap_close(my_bpftimeval ts)
    {
        int exit_code = 0;
        CaptureSummary cs;

        UNREFERENCED_PARAMETER(ts);

        if (libithicap_stats == NULL ||
            libithicap_stats->IsCaptureStopped()) {
            exit_code = -1;
        } else {
            libithicap_stats->StopCapture();

            if (!libithicap_stats->ExportToCaptureSummary(&cs))
            {

                if (logerr != NULL)
                {
                    logerr("libithicap cannot process the capture summary.\n");
                }
                exit_code = -1;

            }
            else if (!cs.Save(libithicap_out_file))
            {
                if (logerr != NULL)
                {
                    logerr("libithicap cannot save the capture summary on <%s>.\n",
                        libithicap_out_file);
                }
                exit_code = -1;
            }
        }
        return exit_code;
    }